

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O0

int unlzw(FILE *in,FILE *out)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  void *__src;
  long local_a8;
  uint local_9c;
  char_type *p;
  int o;
  int e;
  int i;
  int rsize;
  int n_bits;
  code_int maxmaxcode;
  code_int maxcode;
  code_int free_ent;
  uint bitmask;
  int outpos;
  long posbits;
  long inbits;
  code_int incode;
  code_int oldcode;
  ulong uStack_30;
  int finchar;
  code_int code;
  char_type *stackp;
  FILE *out_local;
  FILE *in_local;
  
  ofd = out;
  if (inptr < insize) {
    local_9c = (uint)inbuf[inptr];
    inptr = inptr + 1;
  }
  else {
    local_9c = fill_inbuf(0);
  }
  maxbits = local_9c;
  block_mode = local_9c & 0x80;
  if ((local_9c & 0x60) != 0) {
    error("warning, unknown flags in unlzw decompression");
  }
  maxbits = maxbits & 0x1f;
  lVar2 = 1L << (sbyte)maxbits;
  if ((uint)maxbits < 0x11) {
    e = insize;
    i = 9;
    maxmaxcode = 0x1ff;
    free_ent._0_4_ = 0x1ff;
    incode = -1;
    oldcode._4_4_ = 0;
    free_ent._4_4_ = 0;
    _bitmask = (ulong)(inptr << 3);
    iVar5 = 0x100;
    if (block_mode != 0) {
      iVar5 = 0x101;
    }
    maxcode = (code_int)iVar5;
    memset(prev,0,0x100);
    for (uStack_30 = 0xff; -1 < (long)uStack_30; uStack_30 = uStack_30 + -1) {
      window[uStack_30] = (uch)uStack_30;
    }
LAB_0028699e:
    do {
      iVar5 = (int)((long)_bitmask >> 3);
      insize = insize - iVar5;
      for (o = 0; o < (int)insize; o = o + 1) {
        inbuf[o] = inbuf[o + iVar5];
      }
      _bitmask = 0;
      if (insize < 0x40) {
        sVar3 = fread(inbuf + insize,1,0x8000,(FILE *)in);
        e = (int)sVar3;
        if (e == -1) {
          error("unexpected end of file");
          exit_code = 1;
          return 1;
        }
        insize = e + insize;
        bytes_in = e + bytes_in;
      }
      uVar4 = incode;
      if (e == 0) {
        local_a8 = (ulong)insize * 8 - (long)(i + -1);
      }
      else {
        local_a8 = ((ulong)insize - (ulong)insize % (ulong)(uint)i) * 8;
      }
      while (incode = uVar4, (long)_bitmask < local_a8) {
        if (maxmaxcode < maxcode) {
          _bitmask = (_bitmask - 1) +
                     ((long)(i << 3) - (long)((_bitmask - 1) + (long)(i << 3)) % (long)(i << 3));
          i = i + 1;
          maxmaxcode = lVar2;
          if (i != maxbits) {
            maxmaxcode = (1L << ((byte)i & 0x3f)) + -1;
          }
          free_ent._0_4_ = (1 << ((byte)i & 0x1f)) - 1;
          goto LAB_0028699e;
        }
        uVar4 = (long)(ulong)*(uint3 *)(inbuf + ((long)_bitmask >> 3)) >> ((byte)_bitmask & 7) &
                (ulong)(uint)free_ent;
        _bitmask = (long)i + _bitmask;
        if (incode == -1) {
          if (0xff < uVar4) {
            error("corrupt input.");
            exit_code = 1;
            return 1;
          }
          oldcode._4_4_ = (uint)uVar4;
          outbuf[(int)free_ent._4_4_] = (uch)uVar4;
          free_ent._4_4_ = free_ent._4_4_ + 1;
        }
        else {
          if ((uVar4 == 0x100) && (block_mode != 0)) {
            memset(prev,0,0x100);
            maxcode = 0x100;
            _bitmask = (_bitmask - 1) +
                       ((long)(i << 3) - (long)((_bitmask - 1) + (long)(i << 3)) % (long)(i << 3));
            i = 9;
            maxmaxcode = 0x1ff;
            free_ent._0_4_ = 0x1ff;
            goto LAB_0028699e;
          }
          code = 0x44b27e;
          uStack_30 = uVar4;
          if (maxcode <= (long)uVar4) {
            if (maxcode < (long)uVar4) {
              if (0 < (int)free_ent._4_4_) {
                write_buf(outbuf,free_ent._4_4_);
                bytes_out = (int)free_ent._4_4_ + bytes_out;
              }
              error("corrupt input.");
              exit_code = 1;
              return 1;
            }
            d_buf[0x7ffe]._1_1_ = (undefined1)oldcode._4_4_;
            code = 0x44b27d;
            uStack_30 = incode;
          }
          for (; 0xff < uStack_30; uStack_30 = (ulong)prev[uStack_30]) {
            *(uch *)(code + -1) = window[uStack_30];
            code = code + -1;
          }
          bVar1 = window[uStack_30];
          oldcode._4_4_ = (uint)bVar1;
          __src = (void *)(code + -1);
          *(byte *)(code + -1) = bVar1;
          o = 0x44b27e - (int)__src;
          code = (code_int)__src;
          if ((int)(free_ent._4_4_ + o) < 0x4000) {
            memcpy(outbuf + (int)free_ent._4_4_,__src,(long)o);
            free_ent._4_4_ = o + free_ent._4_4_;
          }
          else {
            do {
              if ((int)(0x4000 - free_ent._4_4_) < o) {
                o = 0x4000 - free_ent._4_4_;
              }
              if (0 < o) {
                memcpy(outbuf + (int)free_ent._4_4_,(void *)code,(long)o);
                free_ent._4_4_ = o + free_ent._4_4_;
              }
              if (0x3fff < (int)free_ent._4_4_) {
                write_buf(outbuf,free_ent._4_4_);
                bytes_out = (int)free_ent._4_4_ + bytes_out;
                free_ent._4_4_ = 0;
              }
              lVar6 = (long)o;
              o = 0x44b27e - (int)(code + lVar6);
              code = code + lVar6;
            } while (0 < o);
          }
          if (maxcode < lVar2) {
            prev[maxcode] = (ush)incode;
            window[maxcode] = bVar1;
            maxcode = maxcode + 1;
          }
        }
      }
    } while (e != 0);
    if (0 < (int)free_ent._4_4_) {
      write_buf(outbuf,free_ent._4_4_);
      bytes_out = (int)free_ent._4_4_ + bytes_out;
    }
    in_local._4_4_ = 0;
  }
  else {
    error("compressed with too many bits; cannot handle file");
    exit_code = 1;
    in_local._4_4_ = 1;
  }
  return in_local._4_4_;
}

Assistant:

local int unlzw(FILE *in, FILE *out) 
    /* input and output file descriptors */
{
    REG2   char_type  *stackp;
    REG3   code_int   code;
    REG4   int        finchar;
    REG5   code_int   oldcode;
    REG6   code_int   incode;
    REG7   long       inbits;
    REG8   long       posbits;
    REG9   int        outpos;
/*  REG10  int        insize; (global) */
    REG11  unsigned   bitmask;
    REG12  code_int   free_ent;
    REG13  code_int   maxcode;
    REG14  code_int   maxmaxcode;
    REG15  int        n_bits;
    REG16  int        rsize;
    
    ofd = out;

#ifdef MAXSEG_64K
    tab_prefix[0] = tab_prefix0;
    tab_prefix[1] = tab_prefix1;
#endif
    maxbits = get_byte();
    block_mode = maxbits & BLOCK_MODE;
    if ((maxbits & LZW_RESERVED) != 0) {
	error( "warning, unknown flags in unlzw decompression");
    }
    maxbits &= BIT_MASK;
    maxmaxcode = MAXCODE(maxbits);
    
    if (maxbits > BITS) {
	error("compressed with too many bits; cannot handle file");
	exit_code = ERROR;
	return ERROR;
    }
    rsize = insize;
    maxcode = MAXCODE(n_bits = INIT_BITS)-1;
    bitmask = (1<<n_bits)-1;
    oldcode = -1;
    finchar = 0;
    outpos = 0;
    posbits = inptr<<3;

    free_ent = ((block_mode) ? FIRST : 256);
    
    clear_tab_prefixof(); /* Initialize the first 256 entries in the table. */
    
    for (code = 255 ; code >= 0 ; --code) {
	tab_suffixof(code) = (char_type)code;
    }
    do {
	REG1 int i;
	int  e;
	int  o;
	
    resetbuf:
	e = insize-(o = (posbits>>3));
	
	for (i = 0 ; i < e ; ++i) {
	    inbuf[i] = inbuf[i+o];
	}
	insize = e;
	posbits = 0;
	
	if (insize < INBUF_EXTRA) {
/*  modified to use fread instead of read - WDP 10/22/97  */
/*	    if ((rsize = read(in, (char*)inbuf+insize, INBUFSIZ)) == EOF) { */

	    if ((rsize = fread((char*)inbuf+insize, 1, INBUFSIZ, in)) == EOF) {
		error("unexpected end of file");
	        exit_code = ERROR;
                return ERROR;
	    }
	    insize += rsize;
	    bytes_in += (ulg)rsize;
	}
	inbits = ((rsize != 0) ? ((long)insize - insize%n_bits)<<3 : 
		  ((long)insize<<3)-(n_bits-1));
	
	while (inbits > posbits) {
	    if (free_ent > maxcode) {
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		++n_bits;
		if (n_bits == maxbits) {
		    maxcode = maxmaxcode;
		} else {
		    maxcode = MAXCODE(n_bits)-1;
		}
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    input(inbuf,posbits,code,n_bits,bitmask);
	    Tracev((stderr, "%d ", code));

	    if (oldcode == -1) {
		if (code >= 256) {
                    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;
                }

		outbuf[outpos++] = (char_type)(finchar = (int)(oldcode=code));
		continue;
	    }
	    if (code == CLEAR && block_mode) {
		clear_tab_prefixof();
		free_ent = FIRST - 1;
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		maxcode = MAXCODE(n_bits = INIT_BITS)-1;
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    incode = code;
	    stackp = de_stack;
	    
	    if (code >= free_ent) { /* Special case for KwKwK string. */
		if (code > free_ent) {
		    if (outpos > 0) {
			write_buf((char*)outbuf, outpos);
			bytes_out += (ulg)outpos;
		    }
		    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;

		}
		*--stackp = (char_type)finchar;
		code = oldcode;
	    }

	    while ((cmp_code_int)code >= (cmp_code_int)256) {
		/* Generate output characters in reverse order */
		*--stackp = tab_suffixof(code);
		code = tab_prefixof(code);
	    }
	    *--stackp =	(char_type)(finchar = tab_suffixof(code));
	    
	    /* And put them out in forward order */
	    {
	/*	REG1 int	i;   already defined above (WDP) */
	    
		if (outpos+(i = (de_stack-stackp)) >= OUTBUFSIZ) {
		    do {
			if (i > OUTBUFSIZ-outpos) i = OUTBUFSIZ-outpos;

			if (i > 0) {
			    memcpy(outbuf+outpos, stackp, i);
			    outpos += i;
			}
			if (outpos >= OUTBUFSIZ) {
			    write_buf((char*)outbuf, outpos);
			    bytes_out += (ulg)outpos;
			    outpos = 0;
			}
			stackp+= i;
		    } while ((i = (de_stack-stackp)) > 0);
		} else {
		    memcpy(outbuf+outpos, stackp, i);
		    outpos += i;
		}
	    }

	    if ((code = free_ent) < maxmaxcode) { /* Generate the new entry. */

		tab_prefixof(code) = (unsigned short)oldcode;
		tab_suffixof(code) = (char_type)finchar;
		free_ent = code+1;
	    } 
	    oldcode = incode;	/* Remember previous code.	*/
	}
    } while (rsize != 0);
    
    if (outpos > 0) {
	write_buf((char*)outbuf, outpos);
	bytes_out += (ulg)outpos;
    }
    return OK;
}